

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

uint32 Socket::inetAddr(String *addr,uint16 *port)

{
  uint16 *this;
  uint uVar1;
  in_addr_t iVar2;
  char *pcVar3;
  char *pcVar4;
  String local_50;
  char *local_28;
  char *portStr;
  uint16 *port_local;
  String *addr_local;
  
  portStr = (char *)port;
  port_local = (uint16 *)addr;
  local_28 = String::find(addr,':');
  if (local_28 == (char *)0x0) {
    pcVar4 = String::operator_cast_to_char_((String *)port_local);
    iVar2 = inet_addr(pcVar4);
    addr_local._4_4_ = ntohl(iVar2);
  }
  else {
    if (portStr != (char *)0x0) {
      uVar1 = String::toUInt(local_28 + 1);
      *(short *)portStr = (short)uVar1;
    }
    this = port_local;
    pcVar4 = local_28;
    pcVar3 = String::operator_cast_to_char_((String *)port_local);
    String::substr(&local_50,(String *)this,0,(long)pcVar4 - (long)pcVar3);
    pcVar4 = String::operator_cast_to_char_(&local_50);
    iVar2 = inet_addr(pcVar4);
    addr_local._4_4_ = ntohl(iVar2);
    String::~String(&local_50);
  }
  return addr_local._4_4_;
}

Assistant:

uint32 Socket::inetAddr(const String& addr, uint16* port)
{
  const char* portStr = addr.find(':');
  if(portStr)
  {
    if(port)
      *port = (uint16)String::toUInt(portStr + 1);
    return ntohl(inet_addr((const char*)addr.substr(0, (portStr - (const char*)addr))));
  }
  return ntohl(inet_addr((const char*)addr));
}